

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall args::Group::~Group(Group *this)

{
  _Manager_type p_Var1;
  pointer ppBVar2;
  pointer pcVar3;
  
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Group_0011c598;
  p_Var1 = (this->validator).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->validator,(_Any_data *)&this->validator,__destroy_functor);
  }
  ppBVar2 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (ppBVar2 != (pointer)0x0) {
    operator_delete(ppBVar2);
  }
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Base_0011c620;
  pcVar3 = (this->super_Base).help._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_Base).help.field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

virtual ~Group() {}